

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::ChangeColumnTypeInfo::Deserialize(ChangeColumnTypeInfo *this,Deserializer *deserializer)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> *p_Var3;
  uint uVar4;
  int iVar5;
  ChangeColumnTypeInfo *this_00;
  pointer pCVar6;
  pointer *__ptr;
  byte bVar7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var9;
  _Head_base<0UL,_duckdb::ChangeColumnTypeInfo_*,_false> local_58;
  LogicalType local_50;
  
  this_00 = (ChangeColumnTypeInfo *)operator_new(0xb8);
  ChangeColumnTypeInfo(this_00);
  local_58._M_head_impl = this_00;
  pCVar6 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_58);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,400,"column_name");
  if ((char)uVar4 == '\0') {
    p_Var3 = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)
             &local_50.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_50.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_50.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_50.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
         0xffffffffffffff00;
    local_50._0_8_ = p_Var3;
    ::std::__cxx11::string::operator=((string *)&pCVar6->column_name,(string *)&local_50);
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)local_50._0_8_ != p_Var3)
    goto LAB_010a6a60;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])
              ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar6->column_name,(string *)&local_50);
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)local_50._0_8_ !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)
        &local_50.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
LAB_010a6a60:
      operator_delete((void *)local_50._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  pCVar6 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x191,"target_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_50,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (pCVar6->target_type).id_ = local_50.id_;
  (pCVar6->target_type).physical_type_ = local_50.physical_type_;
  peVar1 = (pCVar6->target_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (pCVar6->target_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pCVar6->target_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_50.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (pCVar6->target_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_50.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_50.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_50.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_50);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pCVar6 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_58);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x192,"expression");
  bVar7 = (byte)iVar5;
  if (bVar7 == 0) {
    _Var8._M_head_impl =
         (pCVar6->expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar6->expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 0;
      goto LAB_010a6b8d;
    }
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar5 == '\0') {
      _Var9._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&local_50,deserializer);
      _Var9._M_head_impl = (ParsedExpression *)local_50._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var8._M_head_impl =
         (pCVar6->expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar6->expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var9._M_head_impl;
    if (_Var8._M_head_impl == (ParsedExpression *)0x0) {
      bVar7 = 1;
      goto LAB_010a6b8d;
    }
  }
  (*((_Var8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_010a6b8d:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar7);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> ChangeColumnTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ChangeColumnTypeInfo>(new ChangeColumnTypeInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	deserializer.ReadProperty<LogicalType>(401, "target_type", result->target_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(402, "expression", result->expression);
	return std::move(result);
}